

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
google::protobuf::compiler::cpp::UnknownFieldsVars_abi_cxx11_
          (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cpp *this,Descriptor *desc,Options *opts)

{
  pointer pcVar1;
  ulong *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  FileOptions_OptimizeMode FVar4;
  ulong *puVar5;
  AlphaNum *in_R8;
  size_t in_R9;
  long lVar6;
  bool bVar7;
  string_view format;
  string_view format_00;
  string unknown_fields_type;
  string default_instance;
  allocator_type local_1ba;
  key_equal local_1b9;
  char *local_1b8;
  AlphaNum *local_1b0;
  char local_1a8;
  undefined7 uStack_1a7;
  undefined1 local_198 [48];
  undefined1 local_168 [48];
  string local_138;
  undefined1 *local_110;
  ulong local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined8 local_c0;
  char *local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined8 local_60;
  char *local_58;
  ulong *local_50;
  char *local_48;
  ulong local_40;
  undefined1 *puStack_38;
  
  local_1b8 = &local_1a8;
  local_1b0 = (AlphaNum *)0x0;
  local_1a8 = '\0';
  local_108 = 0;
  local_100 = 0;
  local_110 = &local_100;
  FVar4 = GetOptimizeFor(*(FileDescriptor **)(this + 0x18),(Options *)desc,(bool *)0x0);
  if (FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME) {
    local_f0.second._M_dataplus._M_p._0_7_ = 0x74733a3a647473;
    local_f0.second._7_4_ = 0x676e6972;
    local_f0.first._M_str = &DAT_0000000b;
    local_f0.second._M_string_length._3_1_ = 0;
    local_f0.first._M_len = (size_t)&local_f0.second;
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_f0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0.first._M_len
        != &local_f0.second) {
      operator_delete((void *)local_f0.first._M_len,
                      CONCAT17(local_f0.second._M_dataplus._M_p._7_1_,
                               local_f0.second._M_dataplus._M_p._0_7_) + 1);
    }
    local_f0.first._M_len = 2;
    local_f0.first._M_str = "::";
    bVar7 = *(char *)((long)&desc[1].options_ + 2) != '\0';
    local_168._0_8_ = 6;
    if (bVar7) {
      local_168._0_8_ = 0x10;
    }
    local_168._8_8_ = "proto2";
    if (bVar7) {
      local_168._8_8_ = "google::protobuf";
    }
    local_198._0_8_ = &DAT_0000001a;
    local_198._8_8_ = "::internal::GetEmptyString";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_138,(lts_20250127 *)&local_f0,(AlphaNum *)local_168,(AlphaNum *)local_198,
               in_R8);
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_00d90e40;
  }
  else {
    local_f0.first._M_len = 2;
    local_f0.first._M_str = "::";
    bVar7 = *(char *)((long)&desc[1].options_ + 2) != '\0';
    local_168._0_8_ = 6;
    if (bVar7) {
      local_168._0_8_ = 0x10;
    }
    local_168._8_8_ = "proto2";
    if (bVar7) {
      local_168._8_8_ = "google::protobuf";
    }
    local_198._0_8_ = &DAT_00000011;
    local_198._8_8_ = "::UnknownFieldSet";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_138,(lts_20250127 *)&local_f0,(AlphaNum *)local_168,(AlphaNum *)local_198,
               in_R8);
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    local_f0.first._M_len = (size_t)local_1b0;
    local_f0.first._M_str = local_1b8;
    local_168._0_8_ = 0x12;
    local_168._8_8_ = "::default_instance";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_198,(lts_20250127 *)&local_f0,(AlphaNum *)local_168,local_1b0);
    std::__cxx11::string::operator=((string *)&local_110,(string *)local_198);
    if ((undefined1 *)local_198._0_8_ == local_198 + 0x10) goto LAB_00d90e40;
    local_138.field_2._M_allocated_capacity = CONCAT44(local_198._20_4_,local_198._16_4_);
    local_138._M_dataplus._M_p = (pointer)local_198._0_8_;
  }
  operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
LAB_00d90e40:
  pcVar1 = local_198 + 0x10;
  local_198._8_8_ = (char *)0x0;
  local_198._16_4_ = local_198._16_4_ & 0xffffff00;
  local_168._0_8_ = local_1b0;
  local_168._8_8_ = local_1b8;
  local_168._16_8_ = local_108;
  local_168._24_8_ = local_110;
  format._M_str = local_168;
  format._M_len = (size_t)"_internal_metadata_.unknown_fields<$0>($1)";
  local_198._0_8_ = pcVar1;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)local_198,(Nonnull<std::string_*>)&DAT_0000002a,format,
             (Nullable<const_absl::string_view_*>)0x2,in_R9);
  paVar3 = &local_f0.second.field_2;
  local_f0.first._M_len = 0xe;
  local_f0.first._M_str = "unknown_fields";
  local_f0.second._M_dataplus._M_p._0_7_ = SUB87(paVar3,0);
  local_f0.second._M_dataplus._M_p._7_1_ = (undefined1)((ulong)paVar3 >> 0x38);
  if ((pointer)local_198._0_8_ == pcVar1) {
    local_f0.second.field_2._8_4_ = local_198._24_4_;
    local_f0.second.field_2._12_4_ = local_198._28_4_;
  }
  else {
    local_f0.second._M_dataplus._M_p._0_7_ = (undefined7)local_198._0_8_;
    local_f0.second._M_dataplus._M_p._7_1_ = SUB81(local_198._0_8_,7);
  }
  local_f0.second.field_2._M_allocated_capacity._4_4_ = local_198._20_4_;
  local_f0.second.field_2._M_allocated_capacity._0_4_ = local_198._16_4_;
  local_f0.second._M_string_length._0_3_ = (undefined3)local_198._8_8_;
  local_f0.second._M_string_length._3_1_ = SUB81(local_198._8_8_,3);
  local_f0.second._M_string_length._4_4_ = SUB84(local_198._8_8_,4);
  local_198._8_8_ = (char *)0x0;
  local_198._16_4_ = local_198._16_4_ & 0xffffff00;
  local_c0 = 0x13;
  local_b8 = "unknown_fields_type";
  local_b0[0] = local_a0;
  local_198._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,local_1b8,local_1b8 + (long)(local_1b0->digits_ + -0x10));
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_const_char_(&)[42],_true>
            (&local_90,(char (*) [20])"have_unknown_fields",
             (char (*) [42])"_internal_metadata_.have_unknown_fields()");
  puVar2 = (ulong *)(local_168 + 0x10);
  local_168._8_8_ = (char *)0x0;
  local_168._16_8_ = local_168._16_8_ & 0xffffffffffffff00;
  local_138._M_dataplus._M_p = (pointer)local_1b0;
  local_138._M_string_length = (size_type)local_1b8;
  format_00._M_str = (char *)&local_138;
  format_00._M_len = (size_t)"_internal_metadata_.mutable_unknown_fields<$0>()";
  local_168._0_8_ = puVar2;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)local_168,(Nonnull<std::string_*>)&DAT_00000030,format_00,
             (Nullable<const_absl::string_view_*>)0x1,in_R9);
  puVar5 = &local_40;
  local_60 = 0x16;
  local_58 = "mutable_unknown_fields";
  if ((ulong *)local_168._0_8_ == puVar2) {
    puStack_38 = (undefined1 *)local_168._24_8_;
    local_50 = puVar5;
  }
  else {
    local_50 = (ulong *)local_168._0_8_;
  }
  local_40 = local_168._16_8_;
  local_48 = (char *)local_168._8_8_;
  local_168._8_8_ = (char *)0x0;
  local_168._16_8_ = local_168._16_8_ & 0xffffffffffffff00;
  local_168._0_8_ = puVar2;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::
  raw_hash_set<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>const*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
              *)__return_storage_ptr__,&local_f0,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&stack0xffffffffffffffd0,0,(hasher *)&local_138,&local_1b9,&local_1ba);
  lVar6 = -0xc0;
  do {
    if (puVar5 != (ulong *)puVar5[-2]) {
      operator_delete((ulong *)puVar5[-2],*puVar5 + 1);
    }
    puVar5 = puVar5 + -6;
    lVar6 = lVar6 + 0x30;
  } while (lVar6 != 0);
  if ((ulong *)local_168._0_8_ != puVar2) {
    operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
  }
  if ((pointer)local_198._0_8_ != pcVar1) {
    operator_delete((void *)local_198._0_8_,CONCAT44(local_198._20_4_,local_198._16_4_) + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

absl::flat_hash_map<absl::string_view, std::string> UnknownFieldsVars(
    const Descriptor* desc, const Options& opts) {
  std::string unknown_fields_type;
  std::string default_instance;
  if (UseUnknownFieldSet(desc->file(), opts)) {
    unknown_fields_type =
        absl::StrCat("::", ProtobufNamespace(opts), "::UnknownFieldSet");
    default_instance = absl::StrCat(unknown_fields_type, "::default_instance");
  } else {
    unknown_fields_type =
        PrimitiveTypeName(opts, FieldDescriptor::CPPTYPE_STRING);
    default_instance = absl::StrCat("::", ProtobufNamespace(opts),
                                    "::internal::GetEmptyString");
  }

  return {
      {"unknown_fields",
       absl::Substitute("_internal_metadata_.unknown_fields<$0>($1)",
                        unknown_fields_type, default_instance)},
      {"unknown_fields_type", unknown_fields_type},
      {"have_unknown_fields", "_internal_metadata_.have_unknown_fields()"},
      {"mutable_unknown_fields",
       absl::Substitute("_internal_metadata_.mutable_unknown_fields<$0>()",
                        unknown_fields_type)},
  };
}